

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Matrix * MatrixPerspective(Matrix *__return_storage_ptr__,double fovY,double aspect,double nearPlane
                          ,double farPlane)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined4 uVar4;
  float fVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar9 [16];
  
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 0.0;
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m10 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m5 = 0.0;
  __return_storage_ptr__->m9 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m2 = 0.0;
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m8 = 0.0;
  __return_storage_ptr__->m12 = 0.0;
  __return_storage_ptr__->m1 = 0.0;
  dVar1 = tan(fovY * 0.5);
  dVar1 = dVar1 * nearPlane;
  uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
  dVar3 = aspect * dVar1;
  uVar6 = (undefined4)((ulong)(dVar1 + dVar1) >> 0x20);
  fVar5 = (float)(dVar1 + dVar1);
  __return_storage_ptr__->m8 = ((float)dVar3 - (float)dVar3) / (float)(dVar3 + dVar3);
  fVar7 = (float)nearPlane;
  fVar8 = (float)dVar1;
  auVar11._4_4_ = fVar8 - fVar8;
  auVar11._0_4_ = fVar7 * 2.0;
  auVar11._8_8_ = 0;
  __return_storage_ptr__->m0 = (fVar7 * 2.0) / (float)(dVar3 + dVar3);
  auVar2._4_4_ = fVar5;
  auVar2._0_4_ = fVar5;
  auVar2._8_4_ = uVar6;
  auVar2._12_4_ = uVar6;
  auVar12 = divps(auVar11,auVar2);
  __return_storage_ptr__->m5 = (float)(int)auVar12._0_8_;
  __return_storage_ptr__->m9 = (float)(int)((ulong)auVar12._0_8_ >> 0x20);
  fVar5 = fVar7 + (float)farPlane;
  auVar10._0_8_ = CONCAT44(fVar8,fVar5) ^ 0x8000000080000000;
  __return_storage_ptr__->m11 = -1.0;
  auVar10._8_4_ = -fVar8;
  auVar10._12_4_ = fVar8;
  auVar9._8_8_ = auVar10._8_8_;
  auVar9._0_8_ = CONCAT44(fVar7 * (float)farPlane * -2.0,fVar5) ^ 0x80000000;
  auVar12._4_4_ = (float)(farPlane - nearPlane);
  auVar12._0_4_ = (float)(farPlane - nearPlane);
  auVar12._8_4_ = uVar4;
  auVar12._12_4_ = uVar4;
  auVar12 = divps(auVar9,auVar12);
  __return_storage_ptr__->m10 = (float)(int)auVar12._0_8_;
  __return_storage_ptr__->m14 = (float)(int)((ulong)auVar12._0_8_ >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

RMAPI Matrix MatrixPerspective(double fovY, double aspect, double nearPlane, double farPlane)
{
    Matrix result = { 0 };

    double top = nearPlane*tan(fovY*0.5);
    double bottom = -top;
    double right = top*aspect;
    double left = -right;

    // MatrixFrustum(-right, right, -top, top, near, far);
    float rl = (float)(right - left);
    float tb = (float)(top - bottom);
    float fn = (float)(farPlane - nearPlane);

    result.m0 = ((float)nearPlane*2.0f)/rl;
    result.m5 = ((float)nearPlane*2.0f)/tb;
    result.m8 = ((float)right + (float)left)/rl;
    result.m9 = ((float)top + (float)bottom)/tb;
    result.m10 = -((float)farPlane + (float)nearPlane)/fn;
    result.m11 = -1.0f;
    result.m14 = -((float)farPlane*(float)nearPlane*2.0f)/fn;

    return result;
}